

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresultstore.cpp
# Opt level: O1

ResultIteratorBase QtPrivate::findResult(QMap<int,_QtPrivate::ResultItem> *store,int index)

{
  int iVar1;
  const_iterator _mapIterator;
  QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
  *pQVar2;
  int _vectorIndex;
  QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
  *pQVar3;
  const_iterator cVar4;
  long in_FS_OFFSET;
  ResultIteratorBase RVar5;
  ResultIteratorBase local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (store->d).d.ptr;
  if ((pQVar2 == (QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
                  *)0x0) || ((pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    cVar4._M_node = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar2 == (QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
                   *)0x0) {
      cVar4._M_node = (_Base_ptr)pQVar2;
    }
  }
  else {
    if (pQVar2 == (QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
                   *)0x0) {
      _mapIterator._M_node = (_Base_ptr)0x0;
    }
    else {
      _mapIterator._M_node = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      for (pQVar3 = *(QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
                      **)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
          pQVar3 != (QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
                     *)0x0;
          pQVar3 = *(QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
                     **)((long)&(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
                        (ulong)(iVar1 < index) * 8)) {
        iVar1 = *(int *)&(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (index <= iVar1) {
          _mapIterator._M_node = (_Base_ptr)pQVar3;
        }
      }
    }
    cVar4._M_node = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar2 == (QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
                   *)0x0) {
      cVar4._M_node = (_Base_ptr)pQVar2;
    }
    if (_mapIterator._M_node == cVar4._M_node) {
      _mapIterator._M_node = (_Base_ptr)std::_Rb_tree_decrement(_mapIterator._M_node);
      if (*(int *)&_mapIterator._M_node[1]._M_parent == 0) goto LAB_003dde6c;
    }
    else if (index < *(int *)&(((QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
                                 *)_mapIterator._M_node)->m)._M_t._M_impl.super__Rb_tree_header.
                              _M_header._M_left) {
      if (pQVar2 == (QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
                     *)0x0) {
        pQVar2 = (QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
                  *)0x0;
      }
      else {
        pQVar2 = *(QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
                   **)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      }
      if ((QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
           *)_mapIterator._M_node == pQVar2) goto LAB_003dde6c;
      _mapIterator._M_node = (_Base_ptr)std::_Rb_tree_decrement(_mapIterator._M_node);
    }
    iVar1 = *(int *)&_mapIterator._M_node[1]._M_parent;
    _vectorIndex = index - _mapIterator._M_node[1]._M_color;
    if ((_vectorIndex < (int)(iVar1 + (uint)(iVar1 == 0))) &&
       (index == _mapIterator._M_node[1]._M_color || iVar1 != 0)) goto LAB_003dde6e;
  }
LAB_003dde6c:
  _mapIterator._M_node = cVar4._M_node;
  _vectorIndex = 0;
LAB_003dde6e:
  ResultIteratorBase::ResultIteratorBase
            (&local_28,(const_iterator)_mapIterator._M_node,_vectorIndex);
  RVar5.m_vectorIndex = local_28.m_vectorIndex;
  RVar5.mapIterator.i._M_node = local_28.mapIterator.i._M_node;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  RVar5._12_4_ = 0;
  return RVar5;
}

Assistant:

static ResultIteratorBase findResult(const QMap<int, ResultItem> &store, int index)
{
    if (store.isEmpty())
        return ResultIteratorBase(store.end());
    QMap<int, ResultItem>::const_iterator it = store.lowerBound(index);

    // lowerBound returns either an iterator to the result or an iterator
    // to the nearest greater index. If the latter happens it might be
    // that the result is stored in a vector at the previous index.
    if (it == store.end()) {
        --it;
        if (it.value().isVector() == false) {
            return ResultIteratorBase(store.end());
        }
    } else {
        if (it.key() > index) {
            if (it == store.begin())
                return ResultIteratorBase(store.end());
            --it;
        }
    }

    const int vectorIndex = index - it.key();

    if (vectorIndex >= it.value().count())
        return ResultIteratorBase(store.end());
    else if (it.value().isVector() == false && vectorIndex != 0)
        return ResultIteratorBase(store.end());
    return ResultIteratorBase(it, vectorIndex);
}